

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstatemanager_args.cpp
# Opt level: O2

Result<void> * __thiscall
node::ApplyArgsManOptions
          (Result<void> *__return_storage_ptr__,node *this,ArgsManager *args,Options *opts)

{
  _Rb_tree_color _Var1;
  string_view source_file;
  string original;
  string original_00;
  bool bVar2;
  optional<bool> oVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int64_t iVar7;
  Logger *pLVar8;
  _Storage<long,_true> _Var9;
  uint uVar10;
  string *this_00;
  uint *in_R8;
  long in_FS_OFFSET;
  optional<long> oVar11;
  string_view input;
  string_view input_00;
  string_view str;
  string_view logging_function;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  string local_1c0 [32];
  bilingual_str local_1a0;
  string local_160 [32];
  string log_msg;
  bilingual_str local_100;
  optional<uint256> min_work;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  allocator<char> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-checkblockindex",(allocator<char> *)&value);
  oVar11 = ArgsManager::GetIntArg((ArgsManager *)this,&log_msg);
  std::__cxx11::string::~string((string *)&log_msg);
  if (((undefined1  [16])
       oVar11.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"-checkblockindex",(allocator<char> *)&min_work);
    ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&log_msg,(ArgsManager *)this,(string *)&value);
    if ((args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 ==
        '\0') {
      (args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = 1;
    }
    _Var1 = oVar11.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._0_4_;
    if (log_msg._M_string_length == 0) {
      _Var1 = _S_black;
    }
    (args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var1
    ;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&log_msg);
    std::__cxx11::string::~string((string *)&value);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-checkpoints",(allocator<char> *)&value);
  oVar3 = ArgsManager::GetBoolArg((ArgsManager *)this,&log_msg);
  std::__cxx11::string::~string((string *)&log_msg);
  if (((ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    ((_Storage<bool,_true> *)
    &(args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
    _M_value = oVar3.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool>._M_payload;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-minimumchainwork",(allocator<char> *)&min_work);
  ArgsManager::GetArg(&value,(ArgsManager *)this,&log_msg);
  std::__cxx11::string::~string((string *)&log_msg);
  if (value.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    input._M_str = (char *)opts;
    input._M_len = (size_t)value.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p;
    detail::FromUserHex<uint256>
              (&min_work,
               (detail *)
               value.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length,input);
    if (min_work.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged == true) {
      UintToArith256((arith_uint256 *)&log_msg,(uint256 *)&min_work);
      std::optional<arith_uint256>::operator=
                ((optional<arith_uint256> *)
                 ((long)&(args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_parent + 4),(arith_uint256 *)&log_msg);
      goto LAB_001f69d2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_160,"Invalid minimum work specified (%s), must be up to %d hex digits",local_70
              );
    original._M_string_length = in_stack_fffffffffffffe20;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe18;
    original.field_2._M_allocated_capacity = in_stack_fffffffffffffe28;
    original.field_2._8_4_ = in_stack_fffffffffffffe30;
    original.field_2._12_4_ = in_stack_fffffffffffffe34;
    Untranslated((bilingual_str *)&log_msg,original);
    local_50._M_dataplus._M_p._0_4_ = 0x40;
    tinyformat::format<std::__cxx11::string,unsigned_int>
              (&local_100,(tinyformat *)&log_msg,(bilingual_str *)&value,&local_50,in_R8);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_100);
    bilingual_str::~bilingual_str(&local_100);
    bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
    this_00 = local_160;
LAB_001f6db6:
    std::__cxx11::string::~string(this_00);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&value);
  }
  else {
LAB_001f69d2:
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-assumevalid",(allocator<char> *)&min_work);
    ArgsManager::GetArg(&value,(ArgsManager *)this,&log_msg);
    std::__cxx11::string::~string((string *)&log_msg);
    if (value.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      input_00._M_str = (char *)opts;
      input_00._M_len =
           (size_t)value.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      detail::FromUserHex<uint256>
                (&min_work,
                 (detail *)
                 value.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length,input_00);
      if (min_work.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1c0,
                   "Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"
                   ,local_70);
        original_00._M_string_length = in_stack_fffffffffffffe20;
        original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe18;
        original_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe28;
        original_00.field_2._8_4_ = in_stack_fffffffffffffe30;
        original_00.field_2._12_4_ = in_stack_fffffffffffffe34;
        Untranslated((bilingual_str *)&log_msg,original_00);
        local_50._M_dataplus._M_p._0_4_ = 0x40;
        tinyformat::format<std::__cxx11::string,unsigned_int>
                  (&local_1a0,(tinyformat *)&log_msg,(bilingual_str *)&value,&local_50,in_R8);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_1a0);
        bilingual_str::~bilingual_str(&local_1a0);
        bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
        this_00 = local_1c0;
        goto LAB_001f6db6;
      }
      *(undefined8 *)
       &(args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header =
           min_work.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._0_8_;
      (args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = (_Base_ptr)
             min_work.super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload._8_8_;
      (args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           min_work.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._16_8_;
      (args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_right
           = (_Base_ptr)
             min_work.super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload._24_8_;
      if ((char)(args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header.
                _M_node_count == '\0') {
        *(undefined1 *)
         &(args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count =
             1;
      }
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-maxtipage",(allocator<char> *)&value);
    oVar11 = ArgsManager::GetIntArg((ArgsManager *)this,&log_msg);
    std::__cxx11::string::~string((string *)&log_msg);
    if (((undefined1  [16])
         oVar11.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(long *)&(args->m_settings).rw_settings._M_t._M_impl =
           oVar11.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    ReadDatabaseArgs((ArgsManager *)this,
                     (DBOptions *)&(args->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header
                    );
    ReadDatabaseArgs((ArgsManager *)this,
                     (DBOptions *)
                     ((long)&(args->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_color + 1));
    ReadCoinsViewArgs((ArgsManager *)this,
                      (CoinsViewOptions *)
                      &(args->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-par",(allocator<char> *)&value);
    iVar7 = ArgsManager::GetIntArg((ArgsManager *)this,&log_msg,0);
    std::__cxx11::string::~string((string *)&log_msg);
    iVar5 = (int)iVar7;
    if (iVar5 < 1) {
      iVar4 = GetNumCores();
      iVar5 = iVar4 + iVar5;
    }
    uVar10 = 0xf;
    if (iVar5 - 1U < 0xf) {
      uVar10 = iVar5 - 1U;
    }
    uVar6 = 0;
    if (0 < iVar5) {
      uVar6 = uVar10;
    }
    *(uint *)&(args->m_settings).ro_config._M_t._M_impl = uVar6;
    pLVar8 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar8);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<int>
                ((string *)&value,"Script verification uses %d additional threads\n",
                 (int *)&(args->m_settings).ro_config);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &value);
      std::__cxx11::string::~string((string *)&value);
      pLVar8 = LogInstance();
      value.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x68;
      value.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = (size_type)anon_var_dwarf_32e830;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstatemanager_args.cpp"
      ;
      source_file._M_len = 0x68;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "ApplyArgsManOptions";
      logging_function._M_len = 0x13;
      BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x40,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-maxsigcachesize",(allocator<char> *)&value);
    oVar11 = ArgsManager::GetIntArg((ArgsManager *)this,&log_msg);
    std::__cxx11::string::~string((string *)&log_msg);
    if (((undefined1  [16])
         oVar11.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      _Var9._M_value = 0;
      if (0 < oVar11.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload) {
        _Var9._M_value =
             oVar11.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
      }
      *(_Base_ptr *)&(args->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header =
           (_Base_ptr)(_Var9._M_value << 0x13);
      (args->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)(_Var9._M_value << 0x13);
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& args, ChainstateManager::Options& opts)
{
    if (auto value{args.GetIntArg("-checkblockindex")}) {
        // Interpret bare -checkblockindex argument as 1 instead of 0.
        opts.check_block_index = args.GetArg("-checkblockindex")->empty() ? 1 : *value;
    }

    if (auto value{args.GetBoolArg("-checkpoints")}) opts.checkpoints_enabled = *value;

    if (auto value{args.GetArg("-minimumchainwork")}) {
        if (auto min_work{uint256::FromUserHex(*value)}) {
            opts.minimum_chain_work = UintToArith256(*min_work);
        } else {
            return util::Error{strprintf(Untranslated("Invalid minimum work specified (%s), must be up to %d hex digits"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetArg("-assumevalid")}) {
        if (auto block_hash{uint256::FromUserHex(*value)}) {
            opts.assumed_valid_block = *block_hash;
        } else {
            return util::Error{strprintf(Untranslated("Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetIntArg("-maxtipage")}) opts.max_tip_age = std::chrono::seconds{*value};

    ReadDatabaseArgs(args, opts.block_tree_db);
    ReadDatabaseArgs(args, opts.coins_db);
    ReadCoinsViewArgs(args, opts.coins_view);

    int script_threads = args.GetIntArg("-par", DEFAULT_SCRIPTCHECK_THREADS);
    if (script_threads <= 0) {
        // -par=0 means autodetect (number of cores - 1 script threads)
        // -par=-n means "leave n cores free" (number of cores - n - 1 script threads)
        script_threads += GetNumCores();
    }
    // Subtract 1 because the main thread counts towards the par threads.
    opts.worker_threads_num = std::clamp(script_threads - 1, 0, MAX_SCRIPTCHECK_THREADS);
    LogPrintf("Script verification uses %d additional threads\n", opts.worker_threads_num);

    if (auto max_size = args.GetIntArg("-maxsigcachesize")) {
        // 1. When supplied with a max_size of 0, both the signature cache and
        //    script execution cache create the minimum possible cache (2
        //    elements). Therefore, we can use 0 as a floor here.
        // 2. Multiply first, divide after to avoid integer truncation.
        size_t clamped_size_each = std::max<int64_t>(*max_size, 0) * (1 << 20) / 2;
        opts.script_execution_cache_bytes = clamped_size_each;
        opts.signature_cache_bytes = clamped_size_each;
    }

    return {};
}